

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_count_edges.h
# Opt level: O1

int s2shapeutil::CountEdgesUpTo<S2ShapeIndex>(S2ShapeIndex *index,int max_edges)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  S2ShapeIndex *__range2;
  long *plVar4;
  
  uVar2 = (*index->_vptr_S2ShapeIndex[2])();
  if (uVar2 == 0) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    uVar7 = 0;
    do {
      iVar3 = (*index->_vptr_S2ShapeIndex[3])(index,uVar7);
      plVar4 = (long *)CONCAT44(extraout_var,iVar3);
      if (plVar4 == (long *)0x0) {
        cVar1 = '\x03';
      }
      else {
        iVar3 = (**(code **)(*plVar4 + 0x10))(plVar4);
        iVar5 = iVar5 + iVar3;
        cVar1 = (max_edges <= iVar5) * '\x02';
      }
    } while (((cVar1 == '\x03') || (cVar1 == '\0')) &&
            (uVar6 = (int)uVar7 + 1, uVar7 = (ulong)uVar6, uVar2 != uVar6));
  }
  return iVar5;
}

Assistant:

int CountEdgesUpTo(const S2ShapeIndexType& index, int max_edges) {
  int num_edges = 0;
  for (S2Shape* shape : index) {
    if (shape == nullptr) continue;
    num_edges += shape->num_edges();
    if (num_edges >= max_edges) break;
  }
  return num_edges;
}